

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx::
     BVHNIntersectorKHybrid<4,_8,_1,_false,_embree::avx::ArrayIntersectorK_1<8,_embree::avx::QuadMiIntersectorKMoeller<4,_8,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  Scene *pSVar4;
  float **ppfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  Geometry *pGVar10;
  RTCFilterFunctionN p_Var11;
  ulong uVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined4 uVar63;
  undefined1 auVar64 [32];
  undefined4 uVar65;
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  byte bVar79;
  int iVar80;
  ulong uVar81;
  long lVar82;
  long lVar83;
  uint uVar84;
  uint uVar85;
  ulong *puVar86;
  ulong uVar87;
  ulong uVar88;
  ulong uVar89;
  ulong uVar90;
  ulong uVar91;
  undefined1 auVar93 [16];
  float fVar92;
  float fVar101;
  float fVar102;
  float fVar104;
  float fVar105;
  float fVar106;
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar94 [16];
  float fVar103;
  undefined1 auVar95 [16];
  undefined1 auVar100 [32];
  vint4 bi;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  vint4 ai;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [64];
  undefined1 auVar121 [64];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  float fVar125;
  undefined1 auVar124 [64];
  undefined1 auVar126 [32];
  float fVar128;
  undefined1 auVar127 [32];
  float fVar129;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  undefined1 auVar130 [32];
  float fVar140;
  undefined1 auVar141 [32];
  float fVar143;
  uint uVar144;
  float fVar145;
  uint uVar146;
  float fVar147;
  uint uVar148;
  float fVar149;
  uint uVar150;
  float fVar151;
  uint uVar152;
  float fVar153;
  uint uVar154;
  uint uVar155;
  undefined1 auVar142 [64];
  float fVar156;
  undefined1 auVar157 [32];
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  undefined1 auVar158 [64];
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  ulong *local_d38;
  undefined1 local_ce0 [16];
  undefined1 local_cd0 [16];
  undefined1 local_cc0 [32];
  RTCFilterFunctionNArguments local_c90;
  undefined1 local_c60 [32];
  undefined1 local_c40 [8];
  float fStack_c38;
  float fStack_c34;
  float fStack_c30;
  float fStack_c2c;
  float fStack_c28;
  undefined4 uStack_c24;
  undefined1 local_c20 [32];
  undefined1 local_c00 [16];
  undefined1 local_bf0 [16];
  float local_be0;
  float fStack_bdc;
  float fStack_bd8;
  float fStack_bd4;
  float local_bd0;
  float fStack_bcc;
  float fStack_bc8;
  float fStack_bc4;
  float local_bc0;
  float fStack_bbc;
  float fStack_bb8;
  float fStack_bb4;
  undefined1 local_bb0 [16];
  undefined1 local_ba0 [16];
  undefined1 local_b90 [16];
  undefined1 local_b80 [8];
  float fStack_b78;
  float fStack_b74;
  float fStack_b70;
  float fStack_b6c;
  float fStack_b68;
  undefined4 uStack_b64;
  undefined1 local_b60 [32];
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined1 local_b20 [32];
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  float local_a60;
  float fStack_a5c;
  float fStack_a58;
  float fStack_a54;
  float fStack_a50;
  float fStack_a4c;
  float fStack_a48;
  undefined4 uStack_a44;
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  float local_9c0 [4];
  float fStack_9b0;
  float fStack_9ac;
  float fStack_9a8;
  float fStack_9a4;
  float local_9a0 [4];
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  undefined4 uStack_984;
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  RTCHitN local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  float local_8a0;
  float fStack_89c;
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined4 local_880;
  undefined4 uStack_87c;
  undefined4 uStack_878;
  undefined4 uStack_874;
  undefined4 uStack_870;
  undefined4 uStack_86c;
  undefined4 uStack_868;
  undefined4 uStack_864;
  undefined1 local_860 [16];
  undefined1 local_850 [16];
  uint local_840;
  uint uStack_83c;
  uint uStack_838;
  uint uStack_834;
  uint uStack_830;
  uint uStack_82c;
  uint uStack_828;
  uint uStack_824;
  uint local_820;
  uint uStack_81c;
  uint uStack_818;
  uint uStack_814;
  uint uStack_810;
  uint uStack_80c;
  uint uStack_808;
  uint uStack_804;
  size_t local_800;
  ulong local_7f8 [249];
  
  local_800 = root.ptr;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_b90._4_4_ = uVar1;
  local_b90._0_4_ = uVar1;
  local_b90._8_4_ = uVar1;
  local_b90._12_4_ = uVar1;
  auVar120 = ZEXT1664(local_b90);
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_ba0._4_4_ = uVar1;
  local_ba0._0_4_ = uVar1;
  local_ba0._8_4_ = uVar1;
  local_ba0._12_4_ = uVar1;
  auVar121 = ZEXT1664(local_ba0);
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  local_bb0._4_4_ = uVar1;
  local_bb0._0_4_ = uVar1;
  local_bb0._8_4_ = uVar1;
  local_bb0._12_4_ = uVar1;
  auVar124 = ZEXT1664(local_bb0);
  fVar92 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar101 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar102 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  uVar88 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar89 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar90 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  iVar80 = (tray->tnear).field_0.i[k];
  local_bf0._4_4_ = iVar80;
  local_bf0._0_4_ = iVar80;
  local_bf0._8_4_ = iVar80;
  local_bf0._12_4_ = iVar80;
  auVar142 = ZEXT1664(local_bf0);
  iVar80 = (tray->tfar).field_0.i[k];
  local_c00._4_4_ = iVar80;
  local_c00._0_4_ = iVar80;
  local_c00._8_4_ = iVar80;
  local_c00._12_4_ = iVar80;
  auVar158 = ZEXT1664(local_c00);
  local_b60._16_16_ = mm_lookupmask_ps._240_16_;
  local_b60._0_16_ = mm_lookupmask_ps._0_16_;
  uVar84 = 1 << ((byte)k & 0x1f);
  auVar114._8_4_ = 0x3f800000;
  auVar114._0_8_ = 0x3f8000003f800000;
  auVar114._12_4_ = 0x3f800000;
  auVar114._16_4_ = 0x3f800000;
  auVar114._20_4_ = 0x3f800000;
  auVar114._24_4_ = 0x3f800000;
  auVar114._28_4_ = 0x3f800000;
  auVar96._8_4_ = 0xbf800000;
  auVar96._0_8_ = 0xbf800000bf800000;
  auVar96._12_4_ = 0xbf800000;
  auVar96._16_4_ = 0xbf800000;
  auVar96._20_4_ = 0xbf800000;
  auVar96._24_4_ = 0xbf800000;
  auVar96._28_4_ = 0xbf800000;
  _local_b80 = vblendvps_avx(auVar114,auVar96,local_b60);
  local_d38 = local_7f8;
  fVar103 = fVar92;
  fVar104 = fVar92;
  fVar105 = fVar92;
  fVar106 = fVar101;
  fVar125 = fVar101;
  fVar128 = fVar101;
  fVar131 = fVar102;
  fVar133 = fVar102;
  fVar135 = fVar102;
  local_be0 = fVar102;
  fStack_bdc = fVar102;
  fStack_bd8 = fVar102;
  fStack_bd4 = fVar102;
  local_bd0 = fVar101;
  fStack_bcc = fVar101;
  fStack_bc8 = fVar101;
  fStack_bc4 = fVar101;
  local_bc0 = fVar92;
  fStack_bbc = fVar92;
  fStack_bb8 = fVar92;
  fStack_bb4 = fVar92;
LAB_00f7cced:
  do {
    puVar86 = local_d38;
    if (puVar86 == &local_800) {
LAB_00f7d652:
      return puVar86 != &local_800;
    }
    local_d38 = puVar86 + -1;
    uVar91 = puVar86[-1];
    while ((uVar91 & 8) == 0) {
      auVar95 = vsubps_avx(*(undefined1 (*) [16])(uVar91 + 0x20 + uVar88),auVar120._0_16_);
      auVar93._0_4_ = fVar92 * auVar95._0_4_;
      auVar93._4_4_ = fVar103 * auVar95._4_4_;
      auVar93._8_4_ = fVar104 * auVar95._8_4_;
      auVar93._12_4_ = fVar105 * auVar95._12_4_;
      auVar95 = vsubps_avx(*(undefined1 (*) [16])(uVar91 + 0x20 + uVar89),auVar121._0_16_);
      auVar94._0_4_ = fVar101 * auVar95._0_4_;
      auVar94._4_4_ = fVar106 * auVar95._4_4_;
      auVar94._8_4_ = fVar125 * auVar95._8_4_;
      auVar94._12_4_ = fVar128 * auVar95._12_4_;
      auVar95 = vpmaxsd_avx(auVar93,auVar94);
      auVar93 = vsubps_avx(*(undefined1 (*) [16])(uVar91 + 0x20 + uVar90),auVar124._0_16_);
      auVar107._0_4_ = fVar102 * auVar93._0_4_;
      auVar107._4_4_ = fVar131 * auVar93._4_4_;
      auVar107._8_4_ = fVar133 * auVar93._8_4_;
      auVar107._12_4_ = fVar135 * auVar93._12_4_;
      auVar93 = vpmaxsd_avx(auVar107,auVar142._0_16_);
      auVar95 = vpmaxsd_avx(auVar95,auVar93);
      auVar93 = vsubps_avx(*(undefined1 (*) [16])(uVar91 + 0x20 + (uVar88 ^ 0x10)),auVar120._0_16_);
      auVar108._0_4_ = fVar92 * auVar93._0_4_;
      auVar108._4_4_ = fVar103 * auVar93._4_4_;
      auVar108._8_4_ = fVar104 * auVar93._8_4_;
      auVar108._12_4_ = fVar105 * auVar93._12_4_;
      auVar93 = vsubps_avx(*(undefined1 (*) [16])(uVar91 + 0x20 + (uVar89 ^ 0x10)),auVar121._0_16_);
      auVar112._0_4_ = fVar101 * auVar93._0_4_;
      auVar112._4_4_ = fVar106 * auVar93._4_4_;
      auVar112._8_4_ = fVar125 * auVar93._8_4_;
      auVar112._12_4_ = fVar128 * auVar93._12_4_;
      auVar93 = vpminsd_avx(auVar108,auVar112);
      auVar94 = vsubps_avx(*(undefined1 (*) [16])(uVar91 + 0x20 + (uVar90 ^ 0x10)),auVar124._0_16_);
      auVar113._0_4_ = fVar102 * auVar94._0_4_;
      auVar113._4_4_ = fVar131 * auVar94._4_4_;
      auVar113._8_4_ = fVar133 * auVar94._8_4_;
      auVar113._12_4_ = fVar135 * auVar94._12_4_;
      auVar94 = vpminsd_avx(auVar113,auVar158._0_16_);
      auVar93 = vpminsd_avx(auVar93,auVar94);
      auVar95 = vpcmpgtd_avx(auVar95,auVar93);
      iVar80 = vmovmskps_avx(auVar95);
      if (iVar80 == 0xf) goto LAB_00f7cced;
      bVar79 = (byte)iVar80 ^ 0xf;
      uVar81 = uVar91 & 0xfffffffffffffff0;
      lVar83 = 0;
      if (bVar79 != 0) {
        for (; (bVar79 >> lVar83 & 1) == 0; lVar83 = lVar83 + 1) {
        }
      }
      uVar91 = *(ulong *)(uVar81 + lVar83 * 8);
      uVar85 = bVar79 - 1 & (uint)bVar79;
      uVar87 = (ulong)uVar85;
      if (uVar85 != 0) {
        do {
          *local_d38 = uVar91;
          local_d38 = local_d38 + 1;
          lVar83 = 0;
          if (uVar87 != 0) {
            for (; (uVar87 >> lVar83 & 1) == 0; lVar83 = lVar83 + 1) {
            }
          }
          uVar91 = *(ulong *)(uVar81 + lVar83 * 8);
          uVar87 = uVar87 - 1 & uVar87;
        } while (uVar87 != 0);
      }
    }
    uVar81 = uVar91 & 0xfffffffffffffff0;
    for (lVar83 = 0; lVar83 != (ulong)((uint)uVar91 & 0xf) - 8; lVar83 = lVar83 + 1) {
      lVar82 = lVar83 * 0x60;
      pSVar4 = context->scene;
      ppfVar5 = (pSVar4->vertices).items;
      pfVar6 = ppfVar5[*(uint *)(uVar81 + 0x40 + lVar82)];
      pfVar7 = ppfVar5[*(uint *)(uVar81 + 0x44 + lVar82)];
      pfVar8 = ppfVar5[*(uint *)(uVar81 + 0x48 + lVar82)];
      pfVar9 = ppfVar5[*(uint *)(uVar81 + 0x4c + lVar82)];
      auVar94 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar81 + lVar82)),
                              *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar81 + 8 + lVar82)));
      auVar95 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar81 + lVar82)),
                              *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar81 + 8 + lVar82)));
      auVar107 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar81 + 4 + lVar82)),
                               *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar81 + 0xc + lVar82)));
      auVar93 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar81 + 4 + lVar82)),
                              *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar81 + 0xc + lVar82)));
      auVar112 = vunpcklps_avx(auVar95,auVar93);
      auVar113 = vunpcklps_avx(auVar94,auVar107);
      auVar93 = vunpckhps_avx(auVar94,auVar107);
      auVar107 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar81 + 0x10 + lVar82)),
                               *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar81 + 0x18 + lVar82)));
      auVar95 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar81 + 0x10 + lVar82)),
                              *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar81 + 0x18 + lVar82)));
      auVar108 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar81 + 0x14 + lVar82)),
                               *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar81 + 0x1c + lVar82)));
      auVar94 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar81 + 0x14 + lVar82)),
                              *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar81 + 0x1c + lVar82)));
      auVar55 = vunpcklps_avx(auVar95,auVar94);
      auVar56 = vunpcklps_avx(auVar107,auVar108);
      auVar94 = vunpckhps_avx(auVar107,auVar108);
      auVar108 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar81 + 0x20 + lVar82)),
                               *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar81 + 0x28 + lVar82)));
      auVar95 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar81 + 0x20 + lVar82)),
                              *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar81 + 0x28 + lVar82)));
      auVar57 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar81 + 0x24 + lVar82)),
                              *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar81 + 0x2c + lVar82)));
      auVar107 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar81 + 0x24 + lVar82)),
                               *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar81 + 0x2c + lVar82)));
      auVar58 = vunpcklps_avx(auVar95,auVar107);
      auVar59 = vunpcklps_avx(auVar108,auVar57);
      auVar107 = vunpckhps_avx(auVar108,auVar57);
      auVar57 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar81 + 0x30 + lVar82)),
                              *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar81 + 0x38 + lVar82)));
      auVar95 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar81 + 0x30 + lVar82)),
                              *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar81 + 0x38 + lVar82)));
      auVar60 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar81 + 0x34 + lVar82)),
                              *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar81 + 0x3c + lVar82)));
      auVar108 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar81 + 0x34 + lVar82)),
                               *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar81 + 0x3c + lVar82)));
      auVar61 = vunpcklps_avx(auVar95,auVar108);
      auVar62 = vunpcklps_avx(auVar57,auVar60);
      auVar95 = *(undefined1 (*) [16])(uVar81 + 0x40 + lVar82);
      local_b20._16_16_ = auVar95;
      local_b20._0_16_ = auVar95;
      auVar108 = vunpckhps_avx(auVar57,auVar60);
      lVar82 = uVar81 + 0x50 + lVar82;
      local_b40 = *(undefined8 *)(lVar82 + 0x10);
      uStack_b38 = *(undefined8 *)(lVar82 + 0x18);
      uStack_b30 = local_b40;
      uStack_b28 = uStack_b38;
      auVar126._16_16_ = auVar59;
      auVar126._0_16_ = auVar113;
      auVar127._16_16_ = auVar107;
      auVar127._0_16_ = auVar93;
      auVar130._16_16_ = auVar58;
      auVar130._0_16_ = auVar112;
      auVar109._16_16_ = auVar56;
      auVar109._0_16_ = auVar56;
      auVar122._16_16_ = auVar94;
      auVar122._0_16_ = auVar94;
      auVar115._16_16_ = auVar55;
      auVar115._0_16_ = auVar55;
      auVar141._16_16_ = auVar62;
      auVar141._0_16_ = auVar62;
      auVar157._16_16_ = auVar108;
      auVar157._0_16_ = auVar108;
      auVar97._16_16_ = auVar61;
      auVar97._0_16_ = auVar61;
      local_cc0 = vsubps_avx(auVar126,auVar109);
      auVar96 = vsubps_avx(auVar127,auVar122);
      auVar114 = vsubps_avx(auVar130,auVar115);
      auVar99 = vsubps_avx(auVar141,auVar126);
      auVar109 = vsubps_avx(auVar157,auVar127);
      auVar97 = vsubps_avx(auVar97,auVar130);
      fVar103 = auVar96._0_4_;
      fVar165 = auVar97._0_4_;
      fVar133 = auVar96._4_4_;
      fVar166 = auVar97._4_4_;
      auVar53._4_4_ = fVar166 * fVar133;
      auVar53._0_4_ = fVar165 * fVar103;
      fVar18 = auVar96._8_4_;
      fVar167 = auVar97._8_4_;
      auVar53._8_4_ = fVar167 * fVar18;
      fVar25 = auVar96._12_4_;
      fVar168 = auVar97._12_4_;
      auVar53._12_4_ = fVar168 * fVar25;
      fVar32 = auVar96._16_4_;
      fVar169 = auVar97._16_4_;
      auVar53._16_4_ = fVar169 * fVar32;
      fVar39 = auVar96._20_4_;
      fVar170 = auVar97._20_4_;
      auVar53._20_4_ = fVar170 * fVar39;
      fVar46 = auVar96._24_4_;
      fVar171 = auVar97._24_4_;
      auVar53._24_4_ = fVar171 * fVar46;
      auVar53._28_4_ = auVar61._12_4_;
      fVar104 = auVar114._0_4_;
      fVar156 = auVar109._0_4_;
      fVar135 = auVar114._4_4_;
      fVar159 = auVar109._4_4_;
      auVar54._4_4_ = fVar159 * fVar135;
      auVar54._0_4_ = fVar156 * fVar104;
      fVar19 = auVar114._8_4_;
      fVar160 = auVar109._8_4_;
      auVar54._8_4_ = fVar160 * fVar19;
      fVar26 = auVar114._12_4_;
      fVar161 = auVar109._12_4_;
      auVar54._12_4_ = fVar161 * fVar26;
      fVar33 = auVar114._16_4_;
      fVar162 = auVar109._16_4_;
      auVar54._16_4_ = fVar162 * fVar33;
      fVar40 = auVar114._20_4_;
      fVar163 = auVar109._20_4_;
      auVar54._20_4_ = fVar163 * fVar40;
      fVar47 = auVar114._24_4_;
      uVar63 = auVar56._12_4_;
      fVar164 = auVar109._24_4_;
      auVar54._24_4_ = fVar164 * fVar47;
      auVar54._28_4_ = uVar63;
      local_c20 = vsubps_avx(auVar54,auVar53);
      fVar140 = auVar99._0_4_;
      fVar143 = auVar99._4_4_;
      auVar64._4_4_ = fVar143 * fVar135;
      auVar64._0_4_ = fVar140 * fVar104;
      fVar145 = auVar99._8_4_;
      auVar64._8_4_ = fVar145 * fVar19;
      fVar147 = auVar99._12_4_;
      auVar64._12_4_ = fVar147 * fVar26;
      fVar149 = auVar99._16_4_;
      auVar64._16_4_ = fVar149 * fVar33;
      fVar151 = auVar99._20_4_;
      auVar64._20_4_ = fVar151 * fVar40;
      fVar153 = auVar99._24_4_;
      auVar64._24_4_ = fVar153 * fVar47;
      auVar64._28_4_ = uVar63;
      fVar105 = local_cc0._0_4_;
      fVar13 = local_cc0._4_4_;
      auVar66._4_4_ = fVar166 * fVar13;
      auVar66._0_4_ = fVar165 * fVar105;
      fVar20 = local_cc0._8_4_;
      auVar66._8_4_ = fVar167 * fVar20;
      fVar27 = local_cc0._12_4_;
      auVar66._12_4_ = fVar168 * fVar27;
      fVar34 = local_cc0._16_4_;
      auVar66._16_4_ = fVar169 * fVar34;
      fVar41 = local_cc0._20_4_;
      auVar66._20_4_ = fVar170 * fVar41;
      fVar48 = local_cc0._24_4_;
      uVar65 = auVar55._12_4_;
      auVar66._24_4_ = fVar171 * fVar48;
      auVar66._28_4_ = uVar65;
      _local_c40 = vsubps_avx(auVar66,auVar64);
      auVar67._4_4_ = fVar159 * fVar13;
      auVar67._0_4_ = fVar156 * fVar105;
      auVar67._8_4_ = fVar160 * fVar20;
      auVar67._12_4_ = fVar161 * fVar27;
      auVar67._16_4_ = fVar162 * fVar34;
      auVar67._20_4_ = fVar163 * fVar41;
      auVar67._24_4_ = fVar164 * fVar48;
      auVar67._28_4_ = uVar65;
      auVar68._4_4_ = fVar143 * fVar133;
      auVar68._0_4_ = fVar140 * fVar103;
      auVar68._8_4_ = fVar145 * fVar18;
      auVar68._12_4_ = fVar147 * fVar25;
      auVar68._16_4_ = fVar149 * fVar32;
      auVar68._20_4_ = fVar151 * fVar39;
      auVar68._24_4_ = fVar153 * fVar46;
      auVar68._28_4_ = auVar95._12_4_;
      uVar1 = *(undefined4 *)(ray + k * 4);
      auVar172._4_4_ = uVar1;
      auVar172._0_4_ = uVar1;
      auVar172._8_4_ = uVar1;
      auVar172._12_4_ = uVar1;
      auVar172._16_4_ = uVar1;
      auVar172._20_4_ = uVar1;
      auVar172._24_4_ = uVar1;
      auVar172._28_4_ = uVar1;
      uVar2 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar173._4_4_ = uVar2;
      auVar173._0_4_ = uVar2;
      auVar173._8_4_ = uVar2;
      auVar173._12_4_ = uVar2;
      auVar173._16_4_ = uVar2;
      auVar173._20_4_ = uVar2;
      auVar173._24_4_ = uVar2;
      auVar173._28_4_ = uVar2;
      uVar3 = *(undefined4 *)(ray + k * 4 + 0x40);
      auVar174._4_4_ = uVar3;
      auVar174._0_4_ = uVar3;
      auVar174._8_4_ = uVar3;
      auVar174._12_4_ = uVar3;
      auVar174._16_4_ = uVar3;
      auVar174._20_4_ = uVar3;
      auVar174._24_4_ = uVar3;
      auVar174._28_4_ = uVar3;
      fVar92 = *(float *)(ray + k * 4 + 0xa0);
      local_a40 = vsubps_avx(auVar68,auVar67);
      auVar96 = vsubps_avx(auVar126,auVar172);
      fVar101 = *(float *)(ray + k * 4 + 0xc0);
      auVar114 = vsubps_avx(auVar127,auVar173);
      auVar53 = vsubps_avx(auVar130,auVar174);
      fVar129 = auVar53._0_4_;
      fVar132 = auVar53._4_4_;
      auVar69._4_4_ = fVar132 * fVar92;
      auVar69._0_4_ = fVar129 * fVar92;
      fVar134 = auVar53._8_4_;
      auVar69._8_4_ = fVar134 * fVar92;
      fVar136 = auVar53._12_4_;
      auVar69._12_4_ = fVar136 * fVar92;
      fVar137 = auVar53._16_4_;
      auVar69._16_4_ = fVar137 * fVar92;
      fVar138 = auVar53._20_4_;
      auVar69._20_4_ = fVar138 * fVar92;
      fVar139 = auVar53._24_4_;
      auVar69._24_4_ = fVar139 * fVar92;
      auVar69._28_4_ = uVar1;
      fVar106 = auVar114._0_4_;
      fVar14 = auVar114._4_4_;
      auVar70._4_4_ = fVar101 * fVar14;
      auVar70._0_4_ = fVar101 * fVar106;
      fVar21 = auVar114._8_4_;
      auVar70._8_4_ = fVar101 * fVar21;
      fVar28 = auVar114._12_4_;
      auVar70._12_4_ = fVar101 * fVar28;
      fVar35 = auVar114._16_4_;
      auVar70._16_4_ = fVar101 * fVar35;
      fVar42 = auVar114._20_4_;
      auVar70._20_4_ = fVar101 * fVar42;
      fVar49 = auVar114._24_4_;
      auVar70._24_4_ = fVar101 * fVar49;
      auVar70._28_4_ = uVar2;
      auVar114 = vsubps_avx(auVar70,auVar69);
      fVar102 = *(float *)(ray + k * 4 + 0x80);
      fVar125 = auVar96._0_4_;
      fVar15 = auVar96._4_4_;
      auVar71._4_4_ = fVar101 * fVar15;
      auVar71._0_4_ = fVar101 * fVar125;
      fVar22 = auVar96._8_4_;
      auVar71._8_4_ = fVar101 * fVar22;
      fVar29 = auVar96._12_4_;
      auVar71._12_4_ = fVar101 * fVar29;
      fVar36 = auVar96._16_4_;
      auVar71._16_4_ = fVar101 * fVar36;
      fVar43 = auVar96._20_4_;
      auVar71._20_4_ = fVar101 * fVar43;
      fVar50 = auVar96._24_4_;
      auVar71._24_4_ = fVar101 * fVar50;
      auVar71._28_4_ = uVar3;
      auVar72._4_4_ = fVar132 * fVar102;
      auVar72._0_4_ = fVar129 * fVar102;
      auVar72._8_4_ = fVar134 * fVar102;
      auVar72._12_4_ = fVar136 * fVar102;
      auVar72._16_4_ = fVar137 * fVar102;
      auVar72._20_4_ = fVar138 * fVar102;
      auVar72._24_4_ = fVar139 * fVar102;
      auVar72._28_4_ = uVar63;
      auVar53 = vsubps_avx(auVar72,auVar71);
      auVar73._4_4_ = fVar102 * fVar14;
      auVar73._0_4_ = fVar102 * fVar106;
      auVar73._8_4_ = fVar102 * fVar21;
      auVar73._12_4_ = fVar102 * fVar28;
      auVar73._16_4_ = fVar102 * fVar35;
      auVar73._20_4_ = fVar102 * fVar42;
      auVar73._24_4_ = fVar102 * fVar49;
      auVar73._28_4_ = uVar3;
      auVar74._4_4_ = fVar15 * fVar92;
      auVar74._0_4_ = fVar125 * fVar92;
      auVar74._8_4_ = fVar22 * fVar92;
      auVar74._12_4_ = fVar29 * fVar92;
      auVar74._16_4_ = fVar36 * fVar92;
      auVar74._20_4_ = fVar43 * fVar92;
      auVar74._24_4_ = fVar50 * fVar92;
      auVar74._28_4_ = uVar65;
      auVar54 = vsubps_avx(auVar74,auVar73);
      fVar128 = local_a40._0_4_;
      fVar16 = local_a40._4_4_;
      fVar23 = local_a40._8_4_;
      fVar30 = local_a40._12_4_;
      fVar37 = local_a40._16_4_;
      fVar44 = local_a40._20_4_;
      fVar51 = local_a40._24_4_;
      fVar131 = local_c20._0_4_;
      fVar17 = local_c20._4_4_;
      fVar24 = local_c20._8_4_;
      fVar31 = local_c20._12_4_;
      fVar38 = local_c20._16_4_;
      fVar45 = local_c20._20_4_;
      fVar52 = local_c20._24_4_;
      auVar98._0_4_ = fVar102 * fVar131 + fVar101 * fVar128 + (float)local_c40._0_4_ * fVar92;
      auVar98._4_4_ = fVar102 * fVar17 + fVar101 * fVar16 + (float)local_c40._4_4_ * fVar92;
      auVar98._8_4_ = fVar102 * fVar24 + fVar101 * fVar23 + fStack_c38 * fVar92;
      auVar98._12_4_ = fVar102 * fVar31 + fVar101 * fVar30 + fStack_c34 * fVar92;
      auVar98._16_4_ = fVar102 * fVar38 + fVar101 * fVar37 + fStack_c30 * fVar92;
      auVar98._20_4_ = fVar102 * fVar45 + fVar101 * fVar44 + fStack_c2c * fVar92;
      auVar98._24_4_ = fVar102 * fVar52 + fVar101 * fVar51 + fStack_c28 * fVar92;
      auVar98._28_4_ = fVar101 + fVar101 + fVar92;
      auVar116._8_4_ = 0x80000000;
      auVar116._0_8_ = 0x8000000080000000;
      auVar116._12_4_ = 0x80000000;
      auVar116._16_4_ = 0x80000000;
      auVar116._20_4_ = 0x80000000;
      auVar116._24_4_ = 0x80000000;
      auVar116._28_4_ = 0x80000000;
      auVar96 = vandps_avx(auVar98,auVar116);
      uVar85 = auVar96._0_4_;
      local_b00._0_4_ =
           (float)(uVar85 ^ (uint)(fVar140 * auVar114._0_4_ +
                                  fVar165 * auVar54._0_4_ + fVar156 * auVar53._0_4_));
      uVar144 = auVar96._4_4_;
      local_b00._4_4_ =
           (float)(uVar144 ^
                  (uint)(fVar143 * auVar114._4_4_ +
                        fVar166 * auVar54._4_4_ + fVar159 * auVar53._4_4_));
      uVar146 = auVar96._8_4_;
      local_b00._8_4_ =
           (float)(uVar146 ^
                  (uint)(fVar145 * auVar114._8_4_ +
                        fVar167 * auVar54._8_4_ + fVar160 * auVar53._8_4_));
      uVar148 = auVar96._12_4_;
      local_b00._12_4_ =
           (float)(uVar148 ^
                  (uint)(fVar147 * auVar114._12_4_ +
                        fVar168 * auVar54._12_4_ + fVar161 * auVar53._12_4_));
      uVar150 = auVar96._16_4_;
      local_b00._16_4_ =
           (float)(uVar150 ^
                  (uint)(fVar149 * auVar114._16_4_ +
                        fVar169 * auVar54._16_4_ + fVar162 * auVar53._16_4_));
      uVar152 = auVar96._20_4_;
      local_b00._20_4_ =
           (float)(uVar152 ^
                  (uint)(fVar151 * auVar114._20_4_ +
                        fVar170 * auVar54._20_4_ + fVar163 * auVar53._20_4_));
      uVar154 = auVar96._24_4_;
      local_b00._24_4_ =
           (float)(uVar154 ^
                  (uint)(fVar153 * auVar114._24_4_ +
                        fVar171 * auVar54._24_4_ + fVar164 * auVar53._24_4_));
      uVar155 = auVar96._28_4_;
      local_b00._28_4_ =
           (float)(uVar155 ^ (uint)(auVar99._28_4_ + auVar97._28_4_ + auVar109._28_4_));
      local_ae0._0_4_ =
           (float)(uVar85 ^ (uint)(auVar114._0_4_ * fVar105 +
                                  fVar104 * auVar54._0_4_ + fVar103 * auVar53._0_4_));
      local_ae0._4_4_ =
           (float)(uVar144 ^
                  (uint)(auVar114._4_4_ * fVar13 + fVar135 * auVar54._4_4_ + fVar133 * auVar53._4_4_
                        ));
      local_ae0._8_4_ =
           (float)(uVar146 ^
                  (uint)(auVar114._8_4_ * fVar20 + fVar19 * auVar54._8_4_ + fVar18 * auVar53._8_4_))
      ;
      local_ae0._12_4_ =
           (float)(uVar148 ^
                  (uint)(auVar114._12_4_ * fVar27 +
                        fVar26 * auVar54._12_4_ + fVar25 * auVar53._12_4_));
      local_ae0._16_4_ =
           (float)(uVar150 ^
                  (uint)(auVar114._16_4_ * fVar34 +
                        fVar33 * auVar54._16_4_ + fVar32 * auVar53._16_4_));
      local_ae0._20_4_ =
           (float)(uVar152 ^
                  (uint)(auVar114._20_4_ * fVar41 +
                        fVar40 * auVar54._20_4_ + fVar39 * auVar53._20_4_));
      local_ae0._24_4_ =
           (float)(uVar154 ^
                  (uint)(auVar114._24_4_ * fVar48 +
                        fVar47 * auVar54._24_4_ + fVar46 * auVar53._24_4_));
      local_ae0._28_4_ = (float)(uVar155 ^ (uint)(auVar54._28_4_ + auVar53._28_4_ + -0.0));
      auVar114 = ZEXT1232(ZEXT412(0)) << 0x20;
      auVar96 = vcmpps_avx(local_b00,auVar114,5);
      auVar114 = vcmpps_avx(local_ae0,auVar114,5);
      auVar96 = vandps_avx(auVar96,auVar114);
      auVar117._8_4_ = 0x7fffffff;
      auVar117._0_8_ = 0x7fffffff7fffffff;
      auVar117._12_4_ = 0x7fffffff;
      auVar117._16_4_ = 0x7fffffff;
      auVar117._20_4_ = 0x7fffffff;
      auVar117._24_4_ = 0x7fffffff;
      auVar117._28_4_ = 0x7fffffff;
      local_aa0 = vandps_avx(auVar98,auVar117);
      auVar114 = vcmpps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar98,4);
      auVar96 = vandps_avx(auVar96,auVar114);
      auVar99._0_4_ = local_b00._0_4_ + local_ae0._0_4_;
      auVar99._4_4_ = local_b00._4_4_ + local_ae0._4_4_;
      auVar99._8_4_ = local_b00._8_4_ + local_ae0._8_4_;
      auVar99._12_4_ = local_b00._12_4_ + local_ae0._12_4_;
      auVar99._16_4_ = local_b00._16_4_ + local_ae0._16_4_;
      auVar99._20_4_ = local_b00._20_4_ + local_ae0._20_4_;
      auVar99._24_4_ = local_b00._24_4_ + local_ae0._24_4_;
      auVar99._28_4_ = local_b00._28_4_ + local_ae0._28_4_;
      auVar114 = vcmpps_avx(auVar99,local_aa0,2);
      auVar99 = auVar114 & auVar96;
      if ((((((((auVar99 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar99 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar99 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar99 >> 0x7f,0) != '\0') ||
            (auVar99 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar99 >> 0xbf,0) != '\0') ||
          (auVar99 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar99[0x1f] < '\0') {
        auVar96 = vandps_avx(auVar96,auVar114);
        auVar95 = vpackssdw_avx(auVar96._0_16_,auVar96._16_16_);
        local_ac0._0_4_ =
             (float)(uVar85 ^ (uint)(fVar131 * fVar125 +
                                    (float)local_c40._0_4_ * fVar106 + fVar129 * fVar128));
        local_ac0._4_4_ =
             (float)(uVar144 ^
                    (uint)(fVar17 * fVar15 + (float)local_c40._4_4_ * fVar14 + fVar132 * fVar16));
        local_ac0._8_4_ =
             (float)(uVar146 ^ (uint)(fVar24 * fVar22 + fStack_c38 * fVar21 + fVar134 * fVar23));
        local_ac0._12_4_ =
             (float)(uVar148 ^ (uint)(fVar31 * fVar29 + fStack_c34 * fVar28 + fVar136 * fVar30));
        local_ac0._16_4_ =
             (float)(uVar150 ^ (uint)(fVar38 * fVar36 + fStack_c30 * fVar35 + fVar137 * fVar37));
        local_ac0._20_4_ =
             (float)(uVar152 ^ (uint)(fVar45 * fVar43 + fStack_c2c * fVar42 + fVar138 * fVar44));
        local_ac0._24_4_ =
             (float)(uVar154 ^ (uint)(fVar52 * fVar50 + fStack_c28 * fVar49 + fVar139 * fVar51));
        local_ac0._28_4_ = uVar155 ^ 0x7fc00000;
        fVar92 = *(float *)(ray + k * 4 + 0x60);
        fVar101 = local_aa0._0_4_;
        fVar102 = local_aa0._4_4_;
        auVar75._4_4_ = fVar102 * fVar92;
        auVar75._0_4_ = fVar101 * fVar92;
        fVar103 = local_aa0._8_4_;
        auVar75._8_4_ = fVar103 * fVar92;
        fVar104 = local_aa0._12_4_;
        auVar75._12_4_ = fVar104 * fVar92;
        fVar105 = local_aa0._16_4_;
        auVar75._16_4_ = fVar105 * fVar92;
        fVar106 = local_aa0._20_4_;
        auVar75._20_4_ = fVar106 * fVar92;
        fVar125 = local_aa0._24_4_;
        auVar75._24_4_ = fVar125 * fVar92;
        auVar75._28_4_ = fVar92;
        auVar96 = vcmpps_avx(auVar75,local_ac0,1);
        fVar92 = *(float *)(ray + k * 4 + 0x100);
        auVar120 = ZEXT3264(CONCAT428(fVar92,CONCAT424(fVar92,CONCAT420(fVar92,CONCAT416(fVar92,
                                                  CONCAT412(fVar92,CONCAT48(fVar92,CONCAT44(fVar92,
                                                  fVar92))))))));
        auVar76._4_4_ = fVar92 * fVar102;
        auVar76._0_4_ = fVar92 * fVar101;
        auVar76._8_4_ = fVar92 * fVar103;
        auVar76._12_4_ = fVar92 * fVar104;
        auVar76._16_4_ = fVar92 * fVar105;
        auVar76._20_4_ = fVar92 * fVar106;
        auVar76._24_4_ = fVar92 * fVar125;
        auVar76._28_4_ = 0x7fffffff;
        auVar114 = vcmpps_avx(local_ac0,auVar76,2);
        auVar96 = vandps_avx(auVar96,auVar114);
        auVar93 = vpackssdw_avx(auVar96._0_16_,auVar96._16_16_);
        auVar95 = vpand_avx(auVar93,auVar95);
        auVar93 = vpmovzxwd_avx(auVar95);
        auVar93 = vpslld_avx(auVar93,0x1f);
        auVar94 = vpsrad_avx(auVar93,0x1f);
        auVar93 = vpunpckhwd_avx(auVar95,auVar95);
        auVar93 = vpslld_avx(auVar93,0x1f);
        auVar93 = vpsrad_avx(auVar93,0x1f);
        local_a20._16_16_ = auVar93;
        local_a20._0_16_ = auVar94;
        if ((((((((local_a20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (local_a20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (local_a20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(local_a20 >> 0x7f,0) != '\0') ||
              (local_a20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB161(auVar93 >> 0x3f,0) != '\0') ||
            (local_a20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar93[0xf] < '\0') {
          local_a80 = local_c20;
          local_a60 = (float)local_c40._0_4_;
          fStack_a5c = (float)local_c40._4_4_;
          fStack_a58 = fStack_c38;
          fStack_a54 = fStack_c34;
          fStack_a50 = fStack_c30;
          fStack_a4c = fStack_c2c;
          fStack_a48 = fStack_c28;
          uStack_a44 = uStack_c24;
          local_940 = local_b60;
          auVar114 = vrcpps_avx(local_aa0);
          fVar92 = auVar114._0_4_;
          auVar110._0_4_ = fVar101 * fVar92;
          fVar101 = auVar114._4_4_;
          auVar110._4_4_ = fVar102 * fVar101;
          fVar102 = auVar114._8_4_;
          auVar110._8_4_ = fVar103 * fVar102;
          fVar103 = auVar114._12_4_;
          auVar110._12_4_ = fVar104 * fVar103;
          fVar104 = auVar114._16_4_;
          auVar110._16_4_ = fVar105 * fVar104;
          fVar105 = auVar114._20_4_;
          auVar110._20_4_ = fVar106 * fVar105;
          fVar106 = auVar114._24_4_;
          auVar110._24_4_ = fVar125 * fVar106;
          auVar110._28_4_ = 0;
          auVar123._8_4_ = 0x3f800000;
          auVar123._0_8_ = 0x3f8000003f800000;
          auVar123._12_4_ = 0x3f800000;
          auVar123._16_4_ = 0x3f800000;
          auVar123._20_4_ = 0x3f800000;
          auVar123._24_4_ = 0x3f800000;
          auVar123._28_4_ = 0x3f800000;
          auVar96 = vsubps_avx(auVar123,auVar110);
          fStack_9a4 = auVar96._28_4_;
          fVar92 = fVar92 + fVar92 * auVar96._0_4_;
          fVar101 = fVar101 + fVar101 * auVar96._4_4_;
          fVar102 = fVar102 + fVar102 * auVar96._8_4_;
          fVar103 = fVar103 + fVar103 * auVar96._12_4_;
          fVar104 = fVar104 + fVar104 * auVar96._16_4_;
          fVar105 = fVar105 + fVar105 * auVar96._20_4_;
          fVar106 = fVar106 + fVar106 * auVar96._24_4_;
          local_9c0[0] = fVar92 * local_ac0._0_4_;
          local_9c0[1] = fVar101 * local_ac0._4_4_;
          local_9c0[2] = fVar102 * local_ac0._8_4_;
          local_9c0[3] = fVar103 * local_ac0._12_4_;
          fStack_9b0 = fVar104 * local_ac0._16_4_;
          fStack_9ac = fVar105 * local_ac0._20_4_;
          fStack_9a8 = fVar106 * local_ac0._24_4_;
          auVar77._4_4_ = fVar101 * local_b00._4_4_;
          auVar77._0_4_ = fVar92 * local_b00._0_4_;
          auVar77._8_4_ = fVar102 * local_b00._8_4_;
          auVar77._12_4_ = fVar103 * local_b00._12_4_;
          auVar77._16_4_ = fVar104 * local_b00._16_4_;
          auVar77._20_4_ = fVar105 * local_b00._20_4_;
          auVar77._24_4_ = fVar106 * local_b00._24_4_;
          auVar77._28_4_ = fStack_9a4;
          auVar96 = vminps_avx(auVar77,auVar123);
          auVar78._4_4_ = fVar101 * local_ae0._4_4_;
          auVar78._0_4_ = fVar92 * local_ae0._0_4_;
          auVar78._8_4_ = fVar102 * local_ae0._8_4_;
          auVar78._12_4_ = fVar103 * local_ae0._12_4_;
          auVar78._16_4_ = fVar104 * local_ae0._16_4_;
          auVar78._20_4_ = fVar105 * local_ae0._20_4_;
          auVar78._24_4_ = fVar106 * local_ae0._24_4_;
          auVar78._28_4_ = auVar114._28_4_ + fStack_9a4;
          auVar114 = vminps_avx(auVar78,auVar123);
          auVar99 = vsubps_avx(auVar123,auVar96);
          auVar109 = vsubps_avx(auVar123,auVar114);
          local_9e0 = vblendvps_avx(auVar114,auVar99,local_b60);
          local_a00 = vblendvps_avx(auVar96,auVar109,local_b60);
          local_980._4_4_ = (float)local_c40._4_4_ * (float)local_b80._4_4_;
          local_980._0_4_ = (float)local_c40._0_4_ * (float)local_b80._0_4_;
          local_980._8_4_ = fStack_c38 * fStack_b78;
          local_980._12_4_ = fStack_c34 * fStack_b74;
          local_980._16_4_ = fStack_c30 * fStack_b70;
          local_980._20_4_ = fStack_c2c * fStack_b6c;
          local_980._24_4_ = fStack_c28 * fStack_b68;
          local_980._28_4_ = local_a00._28_4_;
          local_960._4_4_ = fVar16 * (float)local_b80._4_4_;
          local_960._0_4_ = fVar128 * (float)local_b80._0_4_;
          local_960._8_4_ = fVar23 * fStack_b78;
          local_960._12_4_ = fVar30 * fStack_b74;
          local_960._16_4_ = fVar37 * fStack_b70;
          local_960._20_4_ = fVar44 * fStack_b6c;
          local_960._24_4_ = fVar51 * fStack_b68;
          local_960._28_4_ = uStack_b64;
          local_9a0[0] = fVar131 * (float)local_b80._0_4_;
          local_9a0[1] = fVar17 * (float)local_b80._4_4_;
          local_9a0[2] = fVar24 * fStack_b78;
          local_9a0[3] = fVar31 * fStack_b74;
          fStack_990 = fVar38 * fStack_b70;
          fStack_98c = fVar45 * fStack_b6c;
          fStack_988 = fVar52 * fStack_b68;
          uStack_984 = local_9e0._28_4_;
          auVar95 = vpsllw_avx(auVar95,0xf);
          auVar95 = vpacksswb_avx(auVar95,auVar95);
          uVar87 = (ulong)(byte)(SUB161(auVar95 >> 7,0) & 1 | (SUB161(auVar95 >> 0xf,0) & 1) << 1 |
                                 (SUB161(auVar95 >> 0x17,0) & 1) << 2 |
                                 (SUB161(auVar95 >> 0x1f,0) & 1) << 3 |
                                 (SUB161(auVar95 >> 0x27,0) & 1) << 4 |
                                 (SUB161(auVar95 >> 0x2f,0) & 1) << 5 |
                                 (SUB161(auVar95 >> 0x37,0) & 1) << 6 |
                                SUB161(auVar95 >> 0x3f,0) << 7);
          do {
            uVar12 = 0;
            if (uVar87 != 0) {
              for (; (uVar87 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
              }
            }
            uVar85 = *(uint *)(local_b20 + uVar12 * 4);
            pGVar10 = (pSVar4->geometries).items[uVar85].ptr;
            local_cc0._0_8_ = pGVar10;
            if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                local_c60 = auVar120._0_32_;
                uVar1 = *(undefined4 *)(local_a00 + uVar12 * 4);
                local_8c0._4_4_ = uVar1;
                local_8c0._0_4_ = uVar1;
                local_8c0._8_4_ = uVar1;
                local_8c0._12_4_ = uVar1;
                local_8c0._16_4_ = uVar1;
                local_8c0._20_4_ = uVar1;
                local_8c0._24_4_ = uVar1;
                local_8c0._28_4_ = uVar1;
                local_8a0 = local_9c0[uVar12 - 8];
                local_c40 = (undefined1  [8])k;
                *(float *)(ray + k * 4 + 0x100) = local_9c0[uVar12];
                local_c90.context = context->user;
                local_880 = *(undefined4 *)((long)&local_b40 + uVar12 * 4);
                fVar92 = local_9a0[uVar12];
                uVar1 = *(undefined4 *)(local_980 + uVar12 * 4);
                local_900._4_4_ = uVar1;
                local_900._0_4_ = uVar1;
                local_900._8_4_ = uVar1;
                local_900._12_4_ = uVar1;
                local_900._16_4_ = uVar1;
                local_900._20_4_ = uVar1;
                local_900._24_4_ = uVar1;
                local_900._28_4_ = uVar1;
                local_850 = vpshufd_avx(ZEXT416(uVar85),0);
                uVar1 = *(undefined4 *)(local_960 + uVar12 * 4);
                local_8e0._4_4_ = uVar1;
                local_8e0._0_4_ = uVar1;
                local_8e0._8_4_ = uVar1;
                local_8e0._12_4_ = uVar1;
                local_8e0._16_4_ = uVar1;
                local_8e0._20_4_ = uVar1;
                local_8e0._24_4_ = uVar1;
                local_8e0._28_4_ = uVar1;
                local_920[0] = (RTCHitN)SUB41(fVar92,0);
                local_920[1] = (RTCHitN)(char)((uint)fVar92 >> 8);
                local_920[2] = (RTCHitN)(char)((uint)fVar92 >> 0x10);
                local_920[3] = (RTCHitN)(char)((uint)fVar92 >> 0x18);
                local_920[4] = (RTCHitN)SUB41(fVar92,0);
                local_920[5] = (RTCHitN)(char)((uint)fVar92 >> 8);
                local_920[6] = (RTCHitN)(char)((uint)fVar92 >> 0x10);
                local_920[7] = (RTCHitN)(char)((uint)fVar92 >> 0x18);
                local_920[8] = (RTCHitN)SUB41(fVar92,0);
                local_920[9] = (RTCHitN)(char)((uint)fVar92 >> 8);
                local_920[10] = (RTCHitN)(char)((uint)fVar92 >> 0x10);
                local_920[0xb] = (RTCHitN)(char)((uint)fVar92 >> 0x18);
                local_920[0xc] = (RTCHitN)SUB41(fVar92,0);
                local_920[0xd] = (RTCHitN)(char)((uint)fVar92 >> 8);
                local_920[0xe] = (RTCHitN)(char)((uint)fVar92 >> 0x10);
                local_920[0xf] = (RTCHitN)(char)((uint)fVar92 >> 0x18);
                local_920[0x10] = (RTCHitN)SUB41(fVar92,0);
                local_920[0x11] = (RTCHitN)(char)((uint)fVar92 >> 8);
                local_920[0x12] = (RTCHitN)(char)((uint)fVar92 >> 0x10);
                local_920[0x13] = (RTCHitN)(char)((uint)fVar92 >> 0x18);
                local_920[0x14] = (RTCHitN)SUB41(fVar92,0);
                local_920[0x15] = (RTCHitN)(char)((uint)fVar92 >> 8);
                local_920[0x16] = (RTCHitN)(char)((uint)fVar92 >> 0x10);
                local_920[0x17] = (RTCHitN)(char)((uint)fVar92 >> 0x18);
                local_920[0x18] = (RTCHitN)SUB41(fVar92,0);
                local_920[0x19] = (RTCHitN)(char)((uint)fVar92 >> 8);
                local_920[0x1a] = (RTCHitN)(char)((uint)fVar92 >> 0x10);
                local_920[0x1b] = (RTCHitN)(char)((uint)fVar92 >> 0x18);
                local_920[0x1c] = (RTCHitN)SUB41(fVar92,0);
                local_920[0x1d] = (RTCHitN)(char)((uint)fVar92 >> 8);
                local_920[0x1e] = (RTCHitN)(char)((uint)fVar92 >> 0x10);
                local_920[0x1f] = (RTCHitN)(char)((uint)fVar92 >> 0x18);
                fStack_89c = local_8a0;
                fStack_898 = local_8a0;
                fStack_894 = local_8a0;
                fStack_890 = local_8a0;
                fStack_88c = local_8a0;
                fStack_888 = local_8a0;
                fStack_884 = local_8a0;
                uStack_87c = local_880;
                uStack_878 = local_880;
                uStack_874 = local_880;
                uStack_870 = local_880;
                uStack_86c = local_880;
                uStack_868 = local_880;
                uStack_864 = local_880;
                local_860 = local_850;
                vcmpps_avx(local_8c0,local_8c0,0xf);
                uStack_83c = (local_c90.context)->instID[0];
                local_840 = uStack_83c;
                uStack_838 = uStack_83c;
                uStack_834 = uStack_83c;
                uStack_830 = uStack_83c;
                uStack_82c = uStack_83c;
                uStack_828 = uStack_83c;
                uStack_824 = uStack_83c;
                uStack_81c = (local_c90.context)->instPrimID[0];
                local_820 = uStack_81c;
                uStack_818 = uStack_81c;
                uStack_814 = uStack_81c;
                uStack_810 = uStack_81c;
                uStack_80c = uStack_81c;
                uStack_808 = uStack_81c;
                uStack_804 = uStack_81c;
                local_ce0 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar84 & 0xf) << 4));
                local_cd0 = *(undefined1 (*) [16])
                             (mm_lookupmask_ps + (long)((int)uVar84 >> 4) * 0x10);
                local_c90.valid = (int *)local_ce0;
                local_c90.geometryUserPtr = pGVar10->userPtr;
                local_c20._0_8_ = ray;
                local_c90.hit = local_920;
                local_c90.N = 8;
                local_c90.ray = (RTCRayN *)ray;
                if (pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar10->occlusionFilterN)(&local_c90);
                }
                auVar95 = vpcmpeqd_avx(local_ce0,ZEXT816(0) << 0x40);
                auVar93 = vpcmpeqd_avx(local_cd0,ZEXT816(0) << 0x40);
                auVar118._16_16_ = auVar93;
                auVar118._0_16_ = auVar95;
                auVar96 = _DAT_01f7b020 & ~auVar118;
                if ((((((((auVar96 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar96 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar96 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar96 >> 0x7f,0) == '\0') &&
                      (auVar96 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar96 >> 0xbf,0) == '\0') &&
                    (auVar96 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar96[0x1f]) {
                  auVar100._0_8_ = auVar95._0_8_ ^ 0xffffffffffffffff;
                  auVar100._8_4_ = auVar95._8_4_ ^ 0xffffffff;
                  auVar100._12_4_ = auVar95._12_4_ ^ 0xffffffff;
                  auVar100._16_4_ = auVar93._0_4_ ^ 0xffffffff;
                  auVar100._20_4_ = auVar93._4_4_ ^ 0xffffffff;
                  auVar100._24_4_ = auVar93._8_4_ ^ 0xffffffff;
                  auVar100._28_4_ = auVar93._12_4_ ^ 0xffffffff;
                }
                else {
                  p_Var11 = context->args->filter;
                  if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                      ((*(byte *)(local_cc0._0_8_ + 0x3e) & 0x40) != 0)))) {
                    (*p_Var11)(&local_c90);
                  }
                  auVar95 = vpcmpeqd_avx(local_ce0,ZEXT816(0) << 0x40);
                  auVar93 = vpcmpeqd_avx(local_cd0,ZEXT816(0) << 0x40);
                  auVar111._16_16_ = auVar93;
                  auVar111._0_16_ = auVar95;
                  auVar100._0_8_ = auVar95._0_8_ ^ 0xffffffffffffffff;
                  auVar100._8_4_ = auVar95._8_4_ ^ 0xffffffff;
                  auVar100._12_4_ = auVar95._12_4_ ^ 0xffffffff;
                  auVar100._16_4_ = auVar93._0_4_ ^ 0xffffffff;
                  auVar100._20_4_ = auVar93._4_4_ ^ 0xffffffff;
                  auVar100._24_4_ = auVar93._8_4_ ^ 0xffffffff;
                  auVar100._28_4_ = auVar93._12_4_ ^ 0xffffffff;
                  auVar119._8_4_ = 0xff800000;
                  auVar119._0_8_ = 0xff800000ff800000;
                  auVar119._12_4_ = 0xff800000;
                  auVar119._16_4_ = 0xff800000;
                  auVar119._20_4_ = 0xff800000;
                  auVar119._24_4_ = 0xff800000;
                  auVar119._28_4_ = 0xff800000;
                  auVar96 = vblendvps_avx(auVar119,*(undefined1 (*) [32])(local_c90.ray + 0x100),
                                          auVar111);
                  *(undefined1 (*) [32])(local_c90.ray + 0x100) = auVar96;
                }
                k = (size_t)local_c40;
                ray = (RayK<8> *)local_c20._0_8_;
                if ((((((((auVar100 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar100 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar100 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar100 >> 0x7f,0) == '\0') &&
                      (auVar100 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar100 >> 0xbf,0) == '\0') &&
                    (auVar100 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar100[0x1f]) {
                  auVar120 = ZEXT3264(local_c60);
                  *(int *)(local_c20._0_8_ + (long)local_c40 * 4 + 0x100) = local_c60._0_4_;
                  goto LAB_00f7d554;
                }
              }
              *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
              goto LAB_00f7d652;
            }
LAB_00f7d554:
            uVar87 = uVar87 ^ 1L << (uVar12 & 0x3f);
          } while (uVar87 != 0);
        }
      }
      auVar120 = ZEXT1664(local_b90);
      auVar121 = ZEXT1664(local_ba0);
      auVar124 = ZEXT1664(local_bb0);
      auVar142 = ZEXT1664(local_bf0);
      auVar158 = ZEXT1664(local_c00);
      fVar92 = local_bc0;
      fVar103 = fStack_bbc;
      fVar104 = fStack_bb8;
      fVar105 = fStack_bb4;
      fVar101 = local_bd0;
      fVar106 = fStack_bcc;
      fVar125 = fStack_bc8;
      fVar128 = fStack_bc4;
      fVar102 = local_be0;
      fVar131 = fStack_bdc;
      fVar133 = fStack_bd8;
      fVar135 = fStack_bd4;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }